

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

int xpath_position(lyxp_set **UNUSED_args,uint16_t UNUSED_arg_count,lyd_node *UNUSED_cur_node,
                  lys_module *UNUSED_local_mod,lyxp_set *set,int options)

{
  char *pcVar1;
  longdouble lVar2;
  
  switch(set->type) {
  case LYXP_SET_EMPTY:
    set->type = LYXP_SET_NUMBER;
    lVar2 = (longdouble)0;
    goto LAB_0016f168;
  case LYXP_SET_NODE_SET:
    lVar2 = (longdouble)set->ctx_pos;
    free((set->val).nodes);
    set->type = LYXP_SET_NUMBER;
LAB_0016f168:
    (set->val).num = lVar2;
    return 0;
  case LYXP_SET_SNODE_SET:
    pcVar1 = "schema node set";
    break;
  case LYXP_SET_BOOLEAN:
    pcVar1 = "boolean";
    break;
  case LYXP_SET_NUMBER:
    pcVar1 = "number";
    break;
  case LYXP_SET_STRING:
    pcVar1 = "string";
    break;
  default:
    pcVar1 = (char *)0x0;
  }
  ly_vlog(LYE_XPATH_INCTX,LY_VLOG_NONE,(void *)0x0,pcVar1,"position()");
  return -1;
}

Assistant:

static int
xpath_position(struct lyxp_set **UNUSED(args), uint16_t UNUSED(arg_count), struct lyd_node *UNUSED(cur_node),
               struct lys_module *UNUSED(local_mod), struct lyxp_set *set, int options)
{
    if (set->type == LYXP_SET_EMPTY) {
        set_fill_number(set, 0);
        return EXIT_SUCCESS;
    }
    if (set->type != LYXP_SET_NODE_SET) {
        LOGVAL(LYE_XPATH_INCTX, LY_VLOG_NONE, NULL, print_set_type(set), "position()");
        return -1;
    }

    set_fill_number(set, set->ctx_pos);

    /* UNUSED in 'Release' build type */
    (void)options;
    return EXIT_SUCCESS;
}